

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

void __thiscall QNetworkRequestFactory::setBaseUrl(QNetworkRequestFactory *this,QUrl *url)

{
  bool bVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  QUrl *in_RSI;
  QUrl *in_stack_ffffffffffffffd8;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *in_stack_ffffffffffffffe0;
  
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
            ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x326a71);
  bVar1 = ::operator==((QUrl *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(in_stack_ffffffffffffffe0);
    pQVar2 = QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x326aa8);
    QUrl::operator=(&pQVar2->baseUrl,in_RSI);
  }
  return;
}

Assistant:

void QNetworkRequestFactory::setBaseUrl(const QUrl &url)
{
    if (d->baseUrl == url)
        return;

    d.detach();
    d->baseUrl = url;
}